

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend_bench.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int extraout_EAX;
  long lVar2;
  ALLEGRO_BITMAP *b2;
  Mode MVar3;
  code *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  undefined1 auStack_448 [1024];
  undefined8 uStack_48;
  undefined8 uStack_20;
  
  uStack_20 = 0;
  bVar9 = true;
  if (1 < argc) {
    uStack_20 = 0;
    lVar2 = strtol(argv[1],(char **)0x0,10);
    iVar6 = (int)lVar2;
    if (iVar6 == 2) {
      uStack_20 = 3;
    }
    else if (iVar6 == 1) {
      uStack_20 = 2;
    }
    else {
      if (iVar6 != 0) goto LAB_001023f8;
      uStack_20 = 1;
    }
    bVar9 = false;
  }
LAB_001023f8:
  pcVar4 = atexit;
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar5 = "Could not init Allegro\n";
  }
  else {
    al_init_image_addon();
    al_init_primitives_addon();
    pcVar4 = (code *)0x1e0;
    display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (display != (ALLEGRO_DISPLAY *)0x0) {
      if (bVar9) {
        for (MVar3 = PLAIN_BLIT; MVar3 != 4; MVar3 = MVar3 + PLAIN_BLIT) {
          do_test(MVar3);
        }
      }
      else {
        do_test((Mode)uStack_20);
      }
      al_destroy_display(display);
      return 0;
    }
    pcVar5 = "Error creating display\n";
    display = (ALLEGRO_DISPLAY *)0x0;
  }
  abort_example(pcVar5);
  uStack_48 = uStack_20;
  al_set_new_bitmap_flags(1);
  lVar2 = al_load_bitmap("data/mysha.pcx");
  if (lVar2 != 0) {
    b2 = (ALLEGRO_BITMAP *)al_load_bitmap("data/allegro.pcx");
    if (b2 != (ALLEGRO_BITMAP *)0x0) {
      al_set_target_bitmap(lVar2);
      al_set_blender(0,1,3);
      MVar3 = (Mode)pcVar5;
      step(MVar3,b2);
      al_store_state(auStack_448,0xffff);
      al_set_target_backbuffer(display);
      al_set_blender(0,1,0);
      al_draw_bitmap(0,0,lVar2,0);
      al_flip_display();
      al_restore_state(auStack_448);
      pcVar5 = names[(ulong)pcVar5 & 0xffffffff];
      log_printf("Benchmark: %s\n",pcVar5);
      log_printf("Please wait...\n");
      iVar6 = 100;
      dVar10 = current_clock();
      while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
        step(MVar3,b2);
      }
      dVar11 = current_clock();
      uVar7 = (uint)(500.0 / (dVar11 - dVar10));
      dVar10 = current_clock();
      uVar8 = 0;
      if (0 < (int)uVar7) {
        uVar8 = uVar7;
      }
      while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
        step(MVar3,b2);
      }
      dVar11 = current_clock();
      log_printf("Time = %g s, %d steps\n",(ulong)uVar7);
      log_printf("%s: %g FPS\n",(double)(int)uVar7 / (dVar11 - dVar10),pcVar5);
      log_printf("Done\n");
      al_destroy_bitmap(lVar2);
      iVar6 = al_destroy_bitmap(b2);
      return iVar6;
    }
  }
  iVar6 = 0x103073;
  abort_example("Error loading data/mysha.pcx\n");
  if (iVar6 == 3) {
    iVar6 = al_draw_scaled_rotated_bitmap
                      (0x41200000,0x41200000,0x41200000,0x41200000,0x40000000,0x40000000,0x3dd67750,
                       pcVar4,0);
    return iVar6;
  }
  if (iVar6 == 2) {
    iVar6 = al_draw_scaled_bitmap(0,0,0x43a00000,0x43480000,0,0,0x44200000,0x43f00000,pcVar4,0);
    return iVar6;
  }
  if (iVar6 == 1) {
    iVar6 = al_draw_bitmap(0,0,pcVar4,0);
    return iVar6;
  }
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   enum Mode mode = ALL;
   int i;

   if (argc > 1) {
      i = strtol(argv[1], NULL, 10);
      switch (i) {
         case 0:
            mode = PLAIN_BLIT;
            break;
         case 1:
            mode = SCALED_BLIT;
            break;
         case 2:
            mode = ROTATE_BLIT;
            break;
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }

   open_log();

   al_init_image_addon();
   al_init_primitives_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   if (mode == ALL) {
      for (mode = PLAIN_BLIT; mode <= ROTATE_BLIT; mode++) {
         do_test(mode);
      }
   }
   else {
      do_test(mode);
   }

   al_destroy_display(display);

   close_log(true);

   return 0;
}